

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O2

bool vera::loadOBJ(string *_filename,Mesh *_mesh)

{
  int iVar1;
  pointer paVar2;
  vec4 vVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  iterator iVar7;
  mapped_type *_normal;
  long lVar8;
  size_t i;
  shape_t *shape;
  ulong uVar9;
  long lVar10;
  int vi;
  ulong local_1c0;
  vec4 local_1b8;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  string err;
  string warn;
  string name;
  string base_dir;
  attrib_t attrib;
  
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&smoothVertexNormals,(_filename->_M_dataplus)._M_p,(allocator *)&name);
  getBaseDir(&base_dir,(string *)&smoothVertexNormals);
  std::__cxx11::string::~string((string *)&smoothVertexNormals);
  bVar4 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,(_filename->_M_dataplus)._M_p,
                           base_dir._M_dataplus._M_p,true,true);
  if (warn._M_string_length != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"WARN: ");
    poVar6 = std::operator<<(poVar6,(string *)&warn);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  if (err._M_string_length != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&err);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  if (bVar4) {
    local_1c0 = 0;
    while( true ) {
      if ((ulong)(((long)shapes.
                         super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)shapes.
                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xe0) <= local_1c0) break;
      std::__cxx11::string::string
                ((string *)&name,
                 (string *)
                 (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + local_1c0));
      if (name._M_string_length == 0) {
        toString<unsigned_long>((string *)&smoothVertexNormals,&local_1c0);
        std::__cxx11::string::operator=((string *)&name,(string *)&smoothVertexNormals);
        std::__cxx11::string::~string((string *)&smoothVertexNormals);
      }
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      shape = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_start + local_1c0;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar5 = hasSmoothingGroup(shape);
      if (bVar5) {
        computeSmoothingNormals(&attrib,shape,&smoothVertexNormals);
      }
      lVar10 = 8;
      for (uVar9 = 0;
          paVar2 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_1c0].mesh.indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar9 < (ulong)(((long)shapes.
                                 super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_1c0].mesh.indices.
                                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc);
          uVar9 = uVar9 + 1) {
        vi = *(int *)((long)paVar2 + lVar10 + -8);
        lVar8 = (long)*(int *)((long)paVar2 + lVar10 + -4);
        iVar1 = *(int *)((long)&paVar2->vertex_index + lVar10);
        local_1b8.field_2.z =
             attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)vi * 3 + 2];
        local_1b8.field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
             (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + (long)vi * 3)[0];
        local_1b8.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + (long)vi * 3)[1];
        Mesh::addVertex(_mesh,(vec3 *)&local_1b8);
        if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_1b8 = getColor(&attrib,vi);
          Mesh::addColor(_mesh,&local_1b8);
        }
        if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          if ((smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
             (iVar7 = std::
                      _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                      ::find(&smoothVertexNormals._M_t,&vi),
             (_Rb_tree_header *)iVar7._M_node !=
             &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header)) {
            _normal = std::
                      map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                      ::at(&smoothVertexNormals,&vi);
            Mesh::addNormal(_mesh,_normal);
          }
        }
        else {
          local_1b8.field_2.z =
               attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8 * 3 + 2];
          local_1b8.field_0 =
               (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
               (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8 * 3)[0];
          local_1b8.field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
               (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar8 * 3)[1];
          Mesh::addNormal(_mesh,(vec3 *)&local_1b8);
        }
        vVar3 = local_1b8;
        if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_1b8.field_1.y =
               1.0 - attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar1 * 2 + 1];
          local_1b8.field_0.x =
               attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(long)iVar1 * 2];
          local_1b8._8_8_ = vVar3._8_8_;
          Mesh::addTexCoord(_mesh,(vec2 *)&local_1b8);
        }
        Mesh::addIndex(_mesh,(uint32_t)uVar9);
        lVar10 = lVar10 + 0xc;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::~_Rb_tree(&smoothVertexNormals._M_t);
      std::__cxx11::string::~string((string *)&name);
      local_1c0 = local_1c0 + 1;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to load ");
    poVar6 = std::operator<<(poVar6,(_filename->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&base_dir);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&warn);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  tinyobj::attrib_t::~attrib_t(&attrib);
  return bVar4;
}

Assistant:

bool loadOBJ( const std::string& _filename, Mesh& _mesh ) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) std::cout << "WARN: " << warn << std::endl;
    if (!err.empty()) std::cerr << err << std::endl;
    
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0)
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);

        // std::map<INDEX_TYPE, tinyobj::index_t> unique_indices;
        // std::map<INDEX_TYPE, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // // Associate w material with face
            // int f = (int)floor(i/3);
            // if (shapes[s].mesh.material_ids.size() > 0) {
            //     int material_index = shapes[s].mesh.material_ids[f];

            //     // but only when change
            //     if (mi != material_index) {
            //         mi = material_index;
            //         _mesh.addMaterial( InitMaterial( materials[mi] ) );
            //     }
            // }

            // bool reuse = false;
            // iter = unique_indices.find(vi);

            // // if already exist 
            // if (iter != unique_indices.end())
            //     // and have the same attributes
            //     if ((iter->second.normal_index == ni) &&
            //         (iter->second.texcoord_index == ti) )
            //         reuse = true;

            // Re use the vertex
            // if (reuse)
            //     _mesh.addFaceIndex( (INDEX_TYPE)iter->second.vertex_index );

            // // Other wise create a new one
            // else 
            {
                // unique_indices[vi].vertex_index = iCounter;
                // unique_indices[vi].normal_index = ni;
                // unique_indices[vi].texcoord_index = ti;
                
                _mesh.addVertex( getVertex(attrib, vi) );

                if (attrib.colors.size() > 0)
                    _mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    _mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        _mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    _mesh.addTexCoord( getTexCoords(attrib, ti) );

                // _mesh.addFaceIndex( iCounter );
                // iCounter++;
                _mesh.addIndex(iCounter++);
            }
        }
    }

    return true;
}